

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.h
# Opt level: O2

cmplx klogic::transform::continuous(double x)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  cmplx cVar1;
  
  if ((0.0 <= x) && (x < 6.283185307179586)) {
    cos(x);
    sin(x);
    cVar1._M_value._8_8_ = extraout_RDX;
    cVar1._M_value._0_8_ = extraout_RAX;
    return (cmplx)cVar1._M_value;
  }
  __assert_fail("x >= 0 && x < TWOPI",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/test/../lib/transforms.h"
                ,0x2c,"cmplx klogic::transform::continuous(double)");
}

Assistant:

inline cmplx continuous(double x) {
            assert(x >= 0 && x < TWOPI);

            return std::polar(1.0, x);
        }